

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O2

void check_output(void *input_buffer,void *output_buffer,long frame_count)

{
  int line;
  String *this;
  char *message;
  AssertionResult gtest_ar;
  String local_50;
  long frame_count_local;
  AssertHelper local_30;
  void *input_buffer_local;
  
  local_50.c_str_ = (char *)0x0;
  frame_count_local = frame_count;
  input_buffer_local = input_buffer;
  testing::internal::CmpHelperEQ<void_const*,decltype(nullptr)>
            ((internal *)&gtest_ar,"input_buffer","nullptr",&input_buffer_local,&local_50.c_str_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    line = 0x226;
LAB_0010910a:
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffc0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
               ,line,message);
    this = &local_50;
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffc0,(Message *)this);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_50.c_str_ = (char *)CONCAT44(local_50.c_str_._4_4_,0x100);
    testing::internal::CmpHelperEQ<long,int>
              ((internal *)&gtest_ar,"frame_count","256",&frame_count_local,(int *)&local_50);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_50);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      line = 0x227;
      goto LAB_0010910a;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar.success_ = output_buffer != (void *)0x0;
    if (gtest_ar.success_) goto LAB_0010912f;
    this = (String *)&stack0xffffffffffffffc0;
    testing::Message::Message((Message *)this);
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)&local_50,&gtest_ar,"!!output_buffer","false","true");
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
               ,0x228,local_50.c_str_);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)this);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    testing::internal::String::~String(&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this);
LAB_0010912f:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

void check_output(const void * input_buffer, void * output_buffer, long frame_count)
{
  ASSERT_EQ(input_buffer, nullptr);
  ASSERT_EQ(frame_count, 256);
  ASSERT_TRUE(!!output_buffer);
}